

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O0

void __thiscall CNscPStackEntry::MakeRoom(CNscPStackEntry *this,size_t nSize)

{
  void *__dest;
  long in_RSI;
  long in_RDI;
  uchar *pauchNew;
  
  if (*(ulong *)(in_RDI + 0x80) < (ulong)(*(long *)(in_RDI + 0x78) + in_RSI)) {
    while (*(ulong *)(in_RDI + 0x80) < (ulong)(*(long *)(in_RDI + 0x78) + in_RSI)) {
      *(long *)(in_RDI + 0x80) = *(long *)(in_RDI + 0x80) << 1;
    }
    __dest = operator_new__(*(ulong *)(in_RDI + 0x80));
    memmove(__dest,*(void **)(in_RDI + 0x70),*(size_t *)(in_RDI + 0x78));
    if ((*(long *)(in_RDI + 0x70) != in_RDI + 0x88) && (*(void **)(in_RDI + 0x70) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 0x70));
    }
    *(void **)(in_RDI + 0x70) = __dest;
  }
  return;
}

Assistant:

void MakeRoom (size_t nSize)
	{
		if (m_nDataSize + nSize > m_nDataAlloc)
		{
			while (m_nDataSize + nSize > m_nDataAlloc)
				m_nDataAlloc <<= 1;
			unsigned char *pauchNew = new unsigned char [m_nDataAlloc];
			memmove (pauchNew, m_pauchData, m_nDataSize);
			if (m_pauchData != m_auchDataFast)
				delete [] m_pauchData;
			m_pauchData = pauchNew;
		}
	}